

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O0

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithUnmodeledForces
          (ModelBaseEKFFlexEstimatorIMU *this,bool b)

{
  Index IVar1;
  bool b_local;
  ModelBaseEKFFlexEstimatorIMU *this_local;
  
  if ((bool)(this->withUnmodeledForces_ & 1U) != b) {
    IMUElasticLocalFrameDynamicalSystem::setWithUnmodeledForces(&this->functor_,b);
    IVar1 = IMUElasticLocalFrameDynamicalSystem::getMeasurementSize(&this->functor_);
    KalmanFilterBase::setMeasureSize
              (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,IVar1);
    IVar1 = IMUElasticLocalFrameDynamicalSystem::getInputSize(&this->functor_);
    ZeroDelayObserver::setInputSize
              ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_,IVar1);
    this->withUnmodeledForces_ = b;
    (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
      _vptr_FlexibilityEstimatorBase[0x44])();
  }
  return;
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::setWithUnmodeledForces(bool b)
{
  if(withUnmodeledForces_ != b)
  {
    functor_.setWithUnmodeledForces(b);
    ekf_.setMeasureSize(functor_.getMeasurementSize());
    ekf_.setInputSize(functor_.getInputSize());
    withUnmodeledForces_ = b;
    updateMeasurementCovarianceMatrix_();
  }
}